

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

void google::Append(State *state,char *str,int length)

{
  char *pcVar1;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    if ((uint)(~(length >> 0x1f) & length) == uVar2) {
      if ((state->overflowed & 1U) == 0) {
        *state->out_cur = '\0';
      }
      return;
    }
    if (state->out_end <= state->out_cur + 1) break;
    pcVar1 = str + uVar2;
    uVar2 = uVar2 + 1;
    *state->out_cur = *pcVar1;
    state->out_cur = state->out_cur + 1;
  }
  state->overflowed = true;
  return;
}

Assistant:

static void Append(State *state, const char * const str, const int length) {
  int i;
  for (i = 0; i < length; ++i) {
    if (state->out_cur + 1 < state->out_end) {  // +1 for '\0'
      *state->out_cur = str[i];
      ++state->out_cur;
    } else {
      state->overflowed = true;
      break;
    }
  }
  if (!state->overflowed) {
    *state->out_cur = '\0';  // Terminate it with '\0'
  }
}